

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltcalc.cpp
# Opt level: O0

void eltcalc::GetEventRates(void)

{
  FILE *pFVar1;
  undefined1 local_34 [8];
  occurrence occ_1;
  occurrence_granular occ;
  int granular_date;
  int date_opts;
  FILE *fin;
  
  pFVar1 = fopen("input/event_rates.csv","r");
  if (pFVar1 == (FILE *)0x0) {
    pFVar1 = fopen("input/occurrence.bin","rb");
    if (pFVar1 == (FILE *)0x0) {
      fprintf(_stderr,"FATAL: %s: Error opening file %s\n","GetEventRates","input/occurrence.bin");
      exit(1);
    }
    occ.occ_date_id._4_4_ = 0;
    fread((void *)((long)&occ.occ_date_id + 4),4,1,pFVar1);
    occ.occ_date_id._0_4_ = occ.occ_date_id._4_4_ >> 1;
    if ((int)occ.occ_date_id == 0) {
      GetEventRates<occurrence>((occurrence *)local_34,(FILE *)pFVar1);
    }
    else {
      GetEventRates<occurrence_granular>((occurrence_granular *)&occ_1.period_no,(FILE *)pFVar1);
    }
  }
  else {
    GetEventRates((FILE *)pFVar1);
  }
  return;
}

Assistant:

void GetEventRates()
	{
		// Extract event rates from event rates file if it exists
		FILE *fin = fopen(EVENTRATES_FILE, "r");
		if (fin != nullptr) {
			GetEventRates(fin);
			return;
		}

		// Otherwise calculate event rates from occurrence file
		fin = fopen(OCCURRENCE_FILE, "rb");
		if (fin == nullptr) {
			fprintf(stderr, "FATAL: %s: Error opening file %s\n",
				__func__, OCCURRENCE_FILE);
			exit(EXIT_FAILURE);
		}

		int date_opts = 0;
		fread(&date_opts, sizeof(date_opts), 1, fin);
		int granular_date = date_opts >> 1;
		if (granular_date) {
			occurrence_granular occ;
			GetEventRates(occ, fin);
		} else {
			occurrence occ;
			GetEventRates(occ, fin);
		}
	}